

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

bool google::protobuf::internal::WireFormat::ParseAndMergeField
               (uint32_t tag,FieldDescriptor *field,Message *message,CodedInputStream *input)

{
  char cVar1;
  byte bVar2;
  uint8_t uVar3;
  byte *pbVar4;
  uint8_t *puVar5;
  ulong uVar6;
  bool bVar7;
  undefined1 uVar8;
  uint32_t uVar9;
  UnknownFieldSet *pUVar11;
  Message *pMVar12;
  int64_t iVar13;
  int iVar10;
  ulong uVar14;
  undefined4 extraout_var;
  EnumDescriptor *this;
  EnumValueDescriptor *value_00;
  uint64_t uVar15;
  ulong uVar16;
  unsigned_long uVar17;
  uint uVar18;
  Reflection *this_00;
  Reflection *extraout_RDX;
  Reflection *extraout_RDX_00;
  Reflection *pRVar19;
  Reflection *extraout_RDX_01;
  int value_1;
  int key;
  undefined8 unaff_RBP;
  _Alloc_hider _Var20;
  DescriptorPool *pDVar21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  pair<unsigned_long,_bool> pVar23;
  pair<unsigned_long,_bool> pVar24;
  pair<unsigned_long,_bool> pVar25;
  pair<unsigned_long,_bool> pVar26;
  uint64_t value;
  undefined1 local_f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  CodedInputStream *local_d0;
  uint64_t local_c8;
  Reflection *local_c0;
  FieldDescriptor *local_b8;
  undefined1 local_b0 [32];
  string local_90;
  string local_70;
  string local_50;
  
  (*(message->super_MessageLite)._vptr_MessageLite[0x11])(message);
  uVar16 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
  pRVar19 = this_00;
  if (field == (FieldDescriptor *)0x0) {
    bVar7 = false;
  }
  else {
    local_d0 = input;
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_f0._0_8_ = FieldDescriptor::TypeOnceInit;
      local_b8 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_f0,&local_b8
                );
      pRVar19 = extraout_RDX;
    }
    if ((tag & 7) == *(uint *)(WireFormatLite::kWireTypeForFieldType + (ulong)(byte)field[2] * 4)) {
      uVar16 = 0;
      bVar7 = false;
      input = local_d0;
    }
    else {
      local_c8 = CONCAT44(local_c8._4_4_,tag);
      if ((~(byte)field[1] & 0x60) == 0) {
        if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
          local_f0._0_8_ = FieldDescriptor::TypeOnceInit;
          local_b8 = field;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_f0,
                     &local_b8);
          pRVar19 = extraout_RDX_00;
        }
        if (((tag & 7) != 2) || (0xfffffffb < (byte)field[2] - 0xd)) goto LAB_003c4840;
        uVar16 = 0;
        bVar7 = true;
      }
      else {
LAB_003c4840:
        bVar7 = false;
      }
      input = local_d0;
      tag = (uint)local_c8;
    }
  }
  if ((char)uVar16 != '\0') {
    pUVar11 = Reflection::MutableUnknownFields(this_00,message);
    bVar7 = SkipField(input,tag,pUVar11);
    return bVar7;
  }
  if (bVar7) {
    pbVar4 = input->buffer_;
    if (pbVar4 < input->buffer_end_) {
      uVar18 = (uint)*pbVar4;
      if (-1 < (char)*pbVar4) {
        input->buffer_ = pbVar4 + 1;
        bVar7 = true;
        goto LAB_003c4f05;
      }
    }
    else {
      uVar18 = 0;
    }
    iVar13 = io::CodedInputStream::ReadVarint32Fallback(input,uVar18);
    uVar18 = (uint)iVar13;
    bVar7 = -1 < iVar13;
LAB_003c4f05:
    if (!bVar7) {
      return false;
    }
    uVar9 = io::CodedInputStream::PushLimit(input,uVar18);
    local_d0 = (CodedInputStream *)CONCAT44(local_d0._4_4_,uVar9);
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_f0._0_8_ = FieldDescriptor::TypeOnceInit;
      local_b8 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_f0,&local_b8
                );
    }
    switch(field[2]) {
    case (FieldDescriptor)0x1:
      iVar10 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar10) {
        do {
          puVar5 = input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)puVar5 < 8) {
            bVar7 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64_t *)local_f0);
          }
          else {
            local_f0._0_8_ = *(undefined8 *)puVar5;
            input->buffer_ = puVar5 + 8;
            bVar7 = true;
          }
          if (bVar7 == false) {
            return false;
          }
          Reflection::AddDouble(this_00,message,field,(double)local_f0._0_8_);
          iVar10 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar10);
      }
      break;
    case (FieldDescriptor)0x2:
      iVar10 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar10) {
        do {
          puVar5 = input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)puVar5 < 4) {
            bVar7 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32_t *)local_f0);
          }
          else {
            local_f0._0_4_ = *(undefined4 *)puVar5;
            input->buffer_ = puVar5 + 4;
            bVar7 = true;
          }
          if (bVar7 == false) {
            return false;
          }
          Reflection::AddFloat(this_00,message,field,(float)local_f0._0_4_);
          iVar10 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar10);
      }
      break;
    case (FieldDescriptor)0x3:
      while (iVar10 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar10) {
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) &&
           (uVar17 = (unsigned_long)(char)*puVar5, -1 < (long)uVar17)) {
          input->buffer_ = puVar5 + 1;
          pVar26._8_8_ = 1;
          pVar26.first = (unsigned_long)(puVar5 + 1);
        }
        else {
          pVar26 = io::CodedInputStream::ReadVarint64Fallback(input);
          uVar17 = pVar26.first;
        }
        if (((undefined1  [16])pVar26 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
        Reflection::AddInt64(this_00,message,field,uVar17);
      }
      break;
    case (FieldDescriptor)0x4:
      while (iVar10 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar10) {
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (uVar15 = (uint64_t)(char)*puVar5, -1 < (long)uVar15))
        {
          input->buffer_ = puVar5 + 1;
          pVar24._8_8_ = 1;
          pVar24.first = (unsigned_long)(puVar5 + 1);
        }
        else {
          pVar24 = io::CodedInputStream::ReadVarint64Fallback(input);
          uVar15 = pVar24.first;
        }
        if (((undefined1  [16])pVar24 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
        Reflection::AddUInt64(this_00,message,field,uVar15);
      }
      break;
    case (FieldDescriptor)0x5:
      while (iVar10 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar10) {
        pbVar4 = input->buffer_;
        if (pbVar4 < input->buffer_end_) {
          bVar2 = *pbVar4;
          uVar16 = (ulong)bVar2;
          uVar9 = (uint32_t)bVar2;
          if ((char)bVar2 < '\0') goto LAB_003c5194;
          input->buffer_ = pbVar4 + 1;
          bVar7 = true;
        }
        else {
          uVar9 = 0;
LAB_003c5194:
          uVar16 = io::CodedInputStream::ReadVarint32Fallback(input,uVar9);
          bVar7 = -1 < (long)uVar16;
        }
        if (!bVar7) {
          return false;
        }
        Reflection::AddInt32(this_00,message,field,(int32_t)uVar16);
      }
      break;
    case (FieldDescriptor)0x6:
      iVar10 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar10) {
        do {
          puVar5 = input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)puVar5 < 8) {
            bVar7 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64_t *)local_f0);
            if (!bVar7) {
              return false;
            }
          }
          else {
            local_f0._0_8_ = *(undefined8 *)puVar5;
            input->buffer_ = puVar5 + 8;
          }
          Reflection::AddUInt64(this_00,message,field,local_f0._0_8_);
          iVar10 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar10);
      }
      break;
    case (FieldDescriptor)0x7:
      iVar10 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar10) {
        do {
          puVar5 = input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)puVar5 < 4) {
            bVar7 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32_t *)local_f0);
            if (!bVar7) {
              return false;
            }
          }
          else {
            local_f0._0_4_ = *(undefined4 *)puVar5;
            input->buffer_ = puVar5 + 4;
          }
          Reflection::AddUInt32(this_00,message,field,local_f0._0_4_);
          iVar10 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar10);
      }
      break;
    case (FieldDescriptor)0x8:
      while (iVar10 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar10) {
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (uVar3 = *puVar5, -1 < (long)(char)uVar3)) {
          input->buffer_ = puVar5 + 1;
          pVar23._8_8_ = 1;
          pVar23.first = (long)(char)uVar3;
        }
        else {
          pVar23 = io::CodedInputStream::ReadVarint64Fallback(input);
        }
        if (((undefined1  [16])pVar23 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
        Reflection::AddBool(this_00,message,field,pVar23.first != 0);
      }
      break;
    case (FieldDescriptor)0x9:
    case (FieldDescriptor)0xa:
    case (FieldDescriptor)0xb:
    case (FieldDescriptor)0xc:
      return false;
    case (FieldDescriptor)0xd:
      while (iVar10 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar10) {
        pbVar4 = input->buffer_;
        if (pbVar4 < input->buffer_end_) {
          bVar2 = *pbVar4;
          uVar16 = (ulong)bVar2;
          uVar9 = (uint32_t)bVar2;
          if ((char)bVar2 < '\0') goto LAB_003c5036;
          input->buffer_ = pbVar4 + 1;
          bVar7 = true;
        }
        else {
          uVar9 = 0;
LAB_003c5036:
          uVar16 = io::CodedInputStream::ReadVarint32Fallback(input,uVar9);
          bVar7 = -1 < (long)uVar16;
        }
        if (!bVar7) {
          return false;
        }
        Reflection::AddUInt32(this_00,message,field,(uint32_t)uVar16);
      }
      break;
    case (FieldDescriptor)0xe:
      local_c0 = this_00;
      while (iVar10 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar10) {
        pbVar4 = input->buffer_;
        if (pbVar4 < input->buffer_end_) {
          bVar2 = *pbVar4;
          uVar14 = (ulong)bVar2;
          uVar9 = (uint32_t)bVar2;
          if ((char)bVar2 < '\0') goto LAB_003c5431;
          input->buffer_ = pbVar4 + 1;
          bVar7 = true;
        }
        else {
          uVar9 = 0;
LAB_003c5431:
          uVar14 = io::CodedInputStream::ReadVarint32Fallback(input,uVar9);
          bVar7 = -1 < (long)uVar14;
        }
        uVar6 = uVar16;
        if (bVar7) {
          uVar6 = uVar14;
        }
        uVar16 = uVar6 & 0xffffffff;
        if (!bVar7) {
          return false;
        }
        iVar10 = (*(message->super_MessageLite)._vptr_MessageLite[0x11])(message);
        key = (int)uVar6;
        if (*(char *)(*(long *)(CONCAT44(extraout_var,iVar10) + 0x10) + 0x3a) == '\x03') {
          Reflection::AddEnumValue(local_c0,message,field,key);
        }
        else {
          this = FieldDescriptor::enum_type(field);
          value_00 = EnumDescriptor::FindValueByNumber(this,key);
          if (value_00 == (EnumValueDescriptor *)0x0) {
            local_c8 = (uint64_t)key;
            pUVar11 = Reflection::MutableUnknownFields(local_c0,message);
            UnknownFieldSet::AddVarint(pUVar11,tag >> 3,local_c8);
          }
          else {
            Reflection::AddEnum(local_c0,message,field,value_00);
          }
        }
        if (!bVar7) {
          return false;
        }
      }
      break;
    case (FieldDescriptor)0xf:
      iVar10 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar10) {
        do {
          puVar5 = input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)puVar5 < 4) {
            bVar7 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32_t *)local_f0);
          }
          else {
            local_f0._0_4_ = *(undefined4 *)puVar5;
            input->buffer_ = puVar5 + 4;
            bVar7 = true;
          }
          if (bVar7 == false) {
            return false;
          }
          Reflection::AddInt32(this_00,message,field,local_f0._0_4_);
          iVar10 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar10);
      }
      break;
    case (FieldDescriptor)0x10:
      iVar10 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar10) {
        do {
          puVar5 = input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)puVar5 < 8) {
            bVar7 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64_t *)local_f0);
          }
          else {
            local_f0._0_8_ = *(undefined8 *)puVar5;
            input->buffer_ = puVar5 + 8;
            bVar7 = true;
          }
          if (bVar7 == false) {
            return false;
          }
          Reflection::AddInt64(this_00,message,field,local_f0._0_8_);
          iVar10 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar10);
      }
      break;
    case (FieldDescriptor)0x11:
      while (iVar10 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar10) {
        pbVar4 = input->buffer_;
        if (pbVar4 < input->buffer_end_) {
          bVar2 = *pbVar4;
          uVar16 = (ulong)bVar2;
          uVar9 = (uint32_t)bVar2;
          if ((char)bVar2 < '\0') goto LAB_003c4f7f;
          input->buffer_ = pbVar4 + 1;
          bVar7 = true;
        }
        else {
          uVar9 = 0;
LAB_003c4f7f:
          uVar16 = io::CodedInputStream::ReadVarint32Fallback(input,uVar9);
          bVar7 = -1 < (long)uVar16;
        }
        if (!bVar7) {
          return false;
        }
        Reflection::AddInt32
                  (this_00,message,field,-((uint)uVar16 & 1) ^ (uint)(uVar16 >> 1) & 0x7fffffff);
      }
      break;
    case (FieldDescriptor)0x12:
      while (iVar10 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar10) {
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (uVar16 = (ulong)(char)*puVar5, -1 < (long)uVar16)) {
          input->buffer_ = puVar5 + 1;
          pVar25._8_8_ = 1;
          pVar25.first = (unsigned_long)(puVar5 + 1);
        }
        else {
          pVar25 = io::CodedInputStream::ReadVarint64Fallback(input);
          uVar16 = pVar25.first;
        }
        if (((undefined1  [16])pVar25 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
        Reflection::AddInt64(this_00,message,field,-(ulong)((uint)uVar16 & 1) ^ uVar16 >> 1);
      }
    }
    io::CodedInputStream::PopLimit(input,(uint32_t)local_d0);
    return true;
  }
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_f0._0_8_ = FieldDescriptor::TypeOnceInit;
    local_b8 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_f0,&local_b8);
    pRVar19 = extraout_RDX_01;
  }
  switch(field[2]) {
  case (FieldDescriptor)0x1:
    uVar8 = WireFormatLite::
            ReadPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                      (input,(double *)local_f0);
    if (!(bool)uVar8) {
      return false;
    }
    if ((~(byte)field[1] & 0x60) == 0) {
      Reflection::AddDouble(this_00,message,field,(double)local_f0._0_8_);
    }
    else {
      Reflection::SetDouble(this_00,message,field,(double)local_f0._0_8_);
    }
    break;
  case (FieldDescriptor)0x2:
    uVar8 = WireFormatLite::
            ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                      (input,(float *)local_f0);
    if (!(bool)uVar8) {
      return false;
    }
    if ((~(byte)field[1] & 0x60) == 0) {
      Reflection::AddFloat(this_00,message,field,(float)local_f0._0_4_);
    }
    else {
      Reflection::SetFloat(this_00,message,field,(float)local_f0._0_4_);
    }
    break;
  case (FieldDescriptor)0x3:
    puVar5 = input->buffer_;
    if ((puVar5 < input->buffer_end_) && (uVar17 = (unsigned_long)(char)*puVar5, -1 < (long)uVar17))
    {
      input->buffer_ = puVar5 + 1;
      uVar18 = 1;
    }
    else {
      pVar25 = io::CodedInputStream::ReadVarint64Fallback(input);
      uVar17 = pVar25.first;
      uVar18 = pVar25._8_4_;
    }
    if ((uVar18 & 1) == 0) {
      return false;
    }
    if ((~(byte)field[1] & 0x60) == 0) {
      Reflection::AddInt64(this_00,message,field,uVar17);
    }
    else {
      Reflection::SetInt64(this_00,message,field,uVar17);
    }
    goto LAB_003c4d96;
  case (FieldDescriptor)0x4:
    puVar5 = input->buffer_;
    if ((puVar5 < input->buffer_end_) && (uVar15 = (uint64_t)(char)*puVar5, -1 < (long)uVar15)) {
      input->buffer_ = puVar5 + 1;
      uVar18 = 1;
    }
    else {
      pVar25 = io::CodedInputStream::ReadVarint64Fallback(input);
      uVar15 = pVar25.first;
      uVar18 = pVar25._8_4_;
    }
    if ((uVar18 & 1) == 0) {
      return false;
    }
    if ((~(byte)field[1] & 0x60) == 0) {
      Reflection::AddUInt64(this_00,message,field,uVar15);
    }
    else {
      Reflection::SetUInt64(this_00,message,field,uVar15);
    }
LAB_003c4d96:
    if ((uVar18 & 1) == 0) {
      return false;
    }
    return true;
  case (FieldDescriptor)0x5:
    uVar8 = WireFormatLite::
            ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                      (input,(int32_t *)local_f0);
    goto LAB_003c49cf;
  case (FieldDescriptor)0x6:
    puVar5 = input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar5 < 8) {
      uVar8 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64_t *)local_f0);
    }
    else {
      local_f0._0_8_ = *(undefined8 *)puVar5;
      input->buffer_ = puVar5 + 8;
      uVar8 = true;
    }
    if ((bool)uVar8 == false) {
      return false;
    }
    if ((~(byte)field[1] & 0x60) == 0) {
      Reflection::AddUInt64(this_00,message,field,local_f0._0_8_);
    }
    else {
      Reflection::SetUInt64(this_00,message,field,local_f0._0_8_);
    }
    break;
  case (FieldDescriptor)0x7:
    puVar5 = input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar5 < 4) {
      uVar8 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32_t *)local_f0);
    }
    else {
      local_f0._0_4_ = *(undefined4 *)puVar5;
      input->buffer_ = puVar5 + 4;
      uVar8 = true;
    }
    if ((bool)uVar8 == false) {
      return false;
    }
    goto LAB_003c4c1c;
  case (FieldDescriptor)0x8:
    uVar8 = WireFormatLite::
            ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                      ((WireFormatLite *)input,(CodedInputStream *)local_f0,(bool *)pRVar19);
    if (!(bool)uVar8) {
      return false;
    }
    if ((~(byte)field[1] & 0x60) == 0) {
      Reflection::AddBool(this_00,message,field,local_f0[0]);
    }
    else {
      Reflection::SetBool(this_00,message,field,local_f0[0]);
    }
    break;
  case (FieldDescriptor)0x9:
    cVar1 = *(char *)(*(long *)(field + 0x10) + 0x3a);
    local_f0._8_8_ = (uint8_t *)0x0;
    local_e0._M_local_buf[0] = '\0';
    local_f0._0_8_ = local_f0 + 0x10;
    bVar7 = WireFormatLite::ReadBytes(input,(string *)local_f0);
    if (bVar7) {
      if (cVar1 == '\x03') {
        bVar7 = WireFormatLite::VerifyUtf8String
                          ((char *)local_f0._0_8_,local_f0._8_4_,PARSE,
                           *(char **)(*(long *)(field + 8) + 0x20));
        if (!bVar7) goto LAB_003c4cbe;
      }
      else {
        WireFormatLite::VerifyUtf8String
                  ((char *)local_f0._0_8_,local_f0._8_4_,PARSE,
                   *(char **)(*(long *)(field + 8) + 0x20));
      }
      if ((~(byte)field[1] & 0x60) == 0) {
        paVar22 = &local_50.field_2;
        local_50._M_dataplus._M_p = (pointer)paVar22;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,local_f0._0_8_,(uint8_t *)(local_f0._8_8_ + local_f0._0_8_));
        Reflection::AddString(this_00,message,field,&local_50);
        _Var20._M_p = local_50._M_dataplus._M_p;
      }
      else {
        paVar22 = &local_70.field_2;
        local_70._M_dataplus._M_p = (pointer)paVar22;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,local_f0._0_8_,(uint8_t *)(local_f0._8_8_ + local_f0._0_8_));
        Reflection::SetString(this_00,message,field,&local_70);
        _Var20._M_p = local_70._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var20._M_p != paVar22) {
        operator_delete(_Var20._M_p);
      }
      if ((undefined1 *)local_f0._0_8_ == local_f0 + 0x10) {
        return true;
      }
      operator_delete((void *)local_f0._0_8_);
      return true;
    }
LAB_003c4cbe:
    if ((undefined1 *)local_f0._0_8_ == local_f0 + 0x10) {
      return false;
    }
    operator_delete((void *)local_f0._0_8_);
    return false;
  case (FieldDescriptor)0xa:
    if ((~(byte)field[1] & 0x60) == 0) {
      pMVar12 = Reflection::AddMessage(this_00,message,field,input->extension_factory_);
    }
    else {
      pMVar12 = Reflection::MutableMessage(this_00,message,field,input->extension_factory_);
    }
    uVar8 = WireFormatLite::ReadGroup<google::protobuf::Message>(tag >> 3,input,pMVar12);
    break;
  case (FieldDescriptor)0xb:
    if ((~(byte)field[1] & 0x60) == 0) {
      pMVar12 = Reflection::AddMessage(this_00,message,field,input->extension_factory_);
    }
    else {
      pMVar12 = Reflection::MutableMessage(this_00,message,field,input->extension_factory_);
    }
    uVar8 = WireFormatLite::ReadMessage<google::protobuf::Message>(input,pMVar12);
    break;
  case (FieldDescriptor)0xc:
    local_f0._8_8_ = (uint8_t *)0x0;
    local_e0._M_local_buf[0] = '\0';
    local_f0._0_8_ = local_f0 + 0x10;
    uVar8 = WireFormatLite::ReadBytes(input,(string *)local_f0);
    if (!(bool)uVar8) goto LAB_003c4cbe;
    if ((~(byte)field[1] & 0x60) == 0) {
      pDVar21 = (DescriptorPool *)&local_90.field_2;
      local_90._M_dataplus._M_p = (pointer)pDVar21;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,local_f0._0_8_,(uint8_t *)(local_f0._8_8_ + local_f0._0_8_));
      Reflection::AddString(this_00,message,field,&local_90);
      _Var20._M_p = local_90._M_dataplus._M_p;
    }
    else {
      pDVar21 = (DescriptorPool *)(local_b0 + 0x10);
      local_b0._0_8_ = pDVar21;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_b0,local_f0._0_8_,(uint8_t *)(local_f0._8_8_ + local_f0._0_8_));
      Reflection::SetString(this_00,message,field,(string *)local_b0);
      _Var20._M_p = (pointer)local_b0._0_8_;
    }
    if ((DescriptorPool *)_Var20._M_p != pDVar21) {
      operator_delete(_Var20._M_p);
    }
    if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
      operator_delete((void *)local_f0._0_8_);
    }
    break;
  case (FieldDescriptor)0xd:
    uVar8 = WireFormatLite::
            ReadPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)13>
                      (input,(uint32_t *)local_f0);
    if (!(bool)uVar8) {
      return false;
    }
LAB_003c4c1c:
    if ((~(byte)field[1] & 0x60) == 0) {
      Reflection::AddUInt32(this_00,message,field,local_f0._0_4_);
    }
    else {
      Reflection::SetUInt32(this_00,message,field,local_f0._0_4_);
    }
    break;
  case (FieldDescriptor)0xe:
    uVar8 = WireFormatLite::
            ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                      (input,(int *)local_f0);
    if (!(bool)uVar8) {
      return false;
    }
    if ((~(byte)field[1] & 0x60) == 0) {
      Reflection::AddEnumValue(this_00,message,field,local_f0._0_4_);
    }
    else {
      Reflection::SetEnumValue(this_00,message,field,local_f0._0_4_);
    }
    break;
  case (FieldDescriptor)0xf:
    uVar8 = WireFormatLite::
            ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)15>
                      (input,(int32_t *)local_f0);
    goto LAB_003c49cf;
  case (FieldDescriptor)0x10:
    uVar8 = WireFormatLite::
            ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)16>
                      (input,(int64_t *)local_f0);
    goto LAB_003c4b2f;
  case (FieldDescriptor)0x11:
    uVar8 = WireFormatLite::
            ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)17>
                      (input,(int32_t *)local_f0);
LAB_003c49cf:
    if ((bool)uVar8 == false) {
      return false;
    }
    if ((~(byte)field[1] & 0x60) == 0) {
      Reflection::AddInt32(this_00,message,field,local_f0._0_4_);
    }
    else {
      Reflection::SetInt32(this_00,message,field,local_f0._0_4_);
    }
    break;
  case (FieldDescriptor)0x12:
    uVar8 = WireFormatLite::
            ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)18>
                      ((WireFormatLite *)input,(CodedInputStream *)local_f0,(int64_t *)pRVar19);
LAB_003c4b2f:
    if ((bool)uVar8 == false) {
      return false;
    }
    if ((~(byte)field[1] & 0x60) == 0) {
      Reflection::AddInt64(this_00,message,field,local_f0._0_8_);
    }
    else {
      Reflection::SetInt64(this_00,message,field,local_f0._0_8_);
    }
    break;
  default:
    goto LAB_003c5547;
  }
  if ((bool)uVar8 == false) {
    return false;
  }
LAB_003c5547:
  return true;
}

Assistant:

bool WireFormat::ParseAndMergeField(
    uint32_t tag,
    const FieldDescriptor* field,  // May be nullptr for unknown
    Message* message, io::CodedInputStream* input) {
  const Reflection* message_reflection = message->GetReflection();

  enum { UNKNOWN, NORMAL_FORMAT, PACKED_FORMAT } value_format;

  if (field == nullptr) {
    value_format = UNKNOWN;
  } else if (WireFormatLite::GetTagWireType(tag) ==
             WireTypeForFieldType(field->type())) {
    value_format = NORMAL_FORMAT;
  } else if (field->is_packable() &&
             WireFormatLite::GetTagWireType(tag) ==
                 WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    value_format = PACKED_FORMAT;
  } else {
    // We don't recognize this field. Either the field number is unknown
    // or the wire type doesn't match. Put it in our unknown field set.
    value_format = UNKNOWN;
  }

  if (value_format == UNKNOWN) {
    return SkipField(input, tag,
                     message_reflection->MutableUnknownFields(message));
  } else if (value_format == PACKED_FORMAT) {
    uint32_t length;
    if (!input->ReadVarint32(&length)) return false;
    io::CodedInputStream::Limit limit = input->PushLimit(length);

    switch (field->type()) {
#define HANDLE_PACKED_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)                      \
  case FieldDescriptor::TYPE_##TYPE: {                                         \
    while (input->BytesUntilLimit() > 0) {                                     \
      CPPTYPE value;                                                           \
      if (!WireFormatLite::ReadPrimitive<CPPTYPE,                              \
                                         WireFormatLite::TYPE_##TYPE>(input,   \
                                                                      &value)) \
        return false;                                                          \
      message_reflection->Add##CPPTYPE_METHOD(message, field, value);          \
    }                                                                          \
    break;                                                                     \
  }

      HANDLE_PACKED_TYPE(INT32, int32_t, Int32)
      HANDLE_PACKED_TYPE(INT64, int64_t, Int64)
      HANDLE_PACKED_TYPE(SINT32, int32_t, Int32)
      HANDLE_PACKED_TYPE(SINT64, int64_t, Int64)
      HANDLE_PACKED_TYPE(UINT32, uint32_t, UInt32)
      HANDLE_PACKED_TYPE(UINT64, uint64_t, UInt64)

      HANDLE_PACKED_TYPE(FIXED32, uint32_t, UInt32)
      HANDLE_PACKED_TYPE(FIXED64, uint64_t, UInt64)
      HANDLE_PACKED_TYPE(SFIXED32, int32_t, Int32)
      HANDLE_PACKED_TYPE(SFIXED64, int64_t, Int64)

      HANDLE_PACKED_TYPE(FLOAT, float, Float)
      HANDLE_PACKED_TYPE(DOUBLE, double, Double)

      HANDLE_PACKED_TYPE(BOOL, bool, Bool)
#undef HANDLE_PACKED_TYPE

      case FieldDescriptor::TYPE_ENUM: {
        while (input->BytesUntilLimit() > 0) {
          int value;
          if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                  input, &value))
            return false;
          if (message->GetDescriptor()->file()->syntax() ==
              FileDescriptor::SYNTAX_PROTO3) {
            message_reflection->AddEnumValue(message, field, value);
          } else {
            const EnumValueDescriptor* enum_value =
                field->enum_type()->FindValueByNumber(value);
            if (enum_value != nullptr) {
              message_reflection->AddEnum(message, field, enum_value);
            } else {
              // The enum value is not one of the known values.  Add it to the
              // UnknownFieldSet.
              int64_t sign_extended_value = static_cast<int64_t>(value);
              message_reflection->MutableUnknownFields(message)->AddVarint(
                  WireFormatLite::GetTagFieldNumber(tag), sign_extended_value);
            }
          }
        }

        break;
      }

      case FieldDescriptor::TYPE_STRING:
      case FieldDescriptor::TYPE_GROUP:
      case FieldDescriptor::TYPE_MESSAGE:
      case FieldDescriptor::TYPE_BYTES:
        // Can't have packed fields of these types: these should be caught by
        // the protocol compiler.
        return false;
        break;
    }

    input->PopLimit(limit);
  } else {
    // Non-packed value (value_format == NORMAL_FORMAT)
    switch (field->type()) {
#define HANDLE_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)                            \
  case FieldDescriptor::TYPE_##TYPE: {                                        \
    CPPTYPE value;                                                            \
    if (!WireFormatLite::ReadPrimitive<CPPTYPE, WireFormatLite::TYPE_##TYPE>( \
            input, &value))                                                   \
      return false;                                                           \
    if (field->is_repeated()) {                                               \
      message_reflection->Add##CPPTYPE_METHOD(message, field, value);         \
    } else {                                                                  \
      message_reflection->Set##CPPTYPE_METHOD(message, field, value);         \
    }                                                                         \
    break;                                                                    \
  }

      HANDLE_TYPE(INT32, int32_t, Int32)
      HANDLE_TYPE(INT64, int64_t, Int64)
      HANDLE_TYPE(SINT32, int32_t, Int32)
      HANDLE_TYPE(SINT64, int64_t, Int64)
      HANDLE_TYPE(UINT32, uint32_t, UInt32)
      HANDLE_TYPE(UINT64, uint64_t, UInt64)

      HANDLE_TYPE(FIXED32, uint32_t, UInt32)
      HANDLE_TYPE(FIXED64, uint64_t, UInt64)
      HANDLE_TYPE(SFIXED32, int32_t, Int32)
      HANDLE_TYPE(SFIXED64, int64_t, Int64)

      HANDLE_TYPE(FLOAT, float, Float)
      HANDLE_TYPE(DOUBLE, double, Double)

      HANDLE_TYPE(BOOL, bool, Bool)
#undef HANDLE_TYPE

      case FieldDescriptor::TYPE_ENUM: {
        int value;
        if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                input, &value))
          return false;
        if (field->is_repeated()) {
          message_reflection->AddEnumValue(message, field, value);
        } else {
          message_reflection->SetEnumValue(message, field, value);
        }
        break;
      }

      // Handle strings separately so that we can optimize the ctype=CORD case.
      case FieldDescriptor::TYPE_STRING: {
        bool strict_utf8_check = StrictUtf8Check(field);
        std::string value;
        if (!WireFormatLite::ReadString(input, &value)) return false;
        if (strict_utf8_check) {
          if (!WireFormatLite::VerifyUtf8String(value.data(), value.length(),
                                                WireFormatLite::PARSE,
                                                field->full_name().c_str())) {
            return false;
          }
        } else {
          VerifyUTF8StringNamedField(value.data(), value.length(), PARSE,
                                     field->full_name().c_str());
        }
        if (field->is_repeated()) {
          message_reflection->AddString(message, field, value);
        } else {
          message_reflection->SetString(message, field, value);
        }
        break;
      }

      case FieldDescriptor::TYPE_BYTES: {
        std::string value;
        if (!WireFormatLite::ReadBytes(input, &value)) return false;
        if (field->is_repeated()) {
          message_reflection->AddString(message, field, value);
        } else {
          message_reflection->SetString(message, field, value);
        }
        break;
      }

      case FieldDescriptor::TYPE_GROUP: {
        Message* sub_message;
        if (field->is_repeated()) {
          sub_message = message_reflection->AddMessage(
              message, field, input->GetExtensionFactory());
        } else {
          sub_message = message_reflection->MutableMessage(
              message, field, input->GetExtensionFactory());
        }

        if (!WireFormatLite::ReadGroup(WireFormatLite::GetTagFieldNumber(tag),
                                       input, sub_message))
          return false;
        break;
      }

      case FieldDescriptor::TYPE_MESSAGE: {
        Message* sub_message;
        if (field->is_repeated()) {
          sub_message = message_reflection->AddMessage(
              message, field, input->GetExtensionFactory());
        } else {
          sub_message = message_reflection->MutableMessage(
              message, field, input->GetExtensionFactory());
        }

        if (!WireFormatLite::ReadMessage(input, sub_message)) return false;
        break;
      }
    }
  }

  return true;
}